

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          unsigned_long value,basic_format_specs<wchar_t> *spec)

{
  int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> local_20;
  
  local_20.prefix_size = 0;
  if ((spec->flags_ & 1) != 0) {
    local_20.prefix[0] = '+';
    if ((spec->flags_ & 2) == 0) {
      local_20.prefix[0] = ' ';
    }
    local_20.prefix_size = 1;
  }
  local_20.writer =
       (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *)this;
  local_20.spec = spec;
  local_20.abs_value = value;
  internal::
  handle_int_type_spec<wchar_t,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>>
            (spec->type_,&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type(),
                                   int_writer<T, Spec>(*this, value, spec));
  }